

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_test.cpp
# Opt level: O0

bool run_test_type_conversion<std::reference_wrapper<unsigned_char>const>
               (Boxed_Value *bv,bool expectedpass)

{
  uchar *__uref;
  bad_boxed_cast *e;
  exception *e_1;
  reference_wrapper<unsigned_char> local_28;
  reference_wrapper<unsigned_char> ret;
  bool expectedpass_local;
  Boxed_Value *bv_local;
  
  ret._M_data._7_1_ = expectedpass;
  __uref = chaiscript::boxed_cast<std::reference_wrapper<unsigned_char>const>
                     (bv,(Type_Conversions_State *)0x0);
  std::reference_wrapper<unsigned_char>::reference_wrapper<unsigned_char&,void,unsigned_char*>
            (&local_28,__uref);
  use<std::reference_wrapper<unsigned_char>>(local_28);
  return (bool)(ret._M_data._7_1_ & 1);
}

Assistant:

bool run_test_type_conversion(const Boxed_Value &bv, bool expectedpass) {
  try {
    To ret = chaiscript::boxed_cast<To>(bv);
    use(ret);
  } catch (const chaiscript::exception::bad_boxed_cast &e) {
    if (expectedpass) {
      std::cerr << "Failure in run_test_type_conversion: " << e.what() << '\n';
      return false;
    }
    return true;
  } catch (const std::exception &e) {
    std::cerr << "Unexpected standard exception when attempting cast_conversion: " << e.what() << '\n';
    return false;
  } catch (...) {
    std::cerr << "Unexpected unknown exception when attempting cast_conversion.\n";
    return false;
  }

  return expectedpass;
}